

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  int test_count;
  int test_suite_count;
  int test_count_00;
  int test_count_01;
  undefined1 local_e0 [4];
  int num_disabled;
  uint local_bc;
  undefined1 local_b8 [4];
  int skipped_test_count;
  TimeInMillis local_98;
  string local_90;
  string local_60;
  string local_40;
  int local_1c;
  UnitTest *pUStack_18;
  int param_2_local;
  UnitTest *unit_test_local;
  PrettyUnitTestResultPrinter *this_local;
  
  local_1c = param_2;
  pUStack_18 = unit_test;
  unit_test_local = (UnitTest *)this;
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  uVar2 = UnitTest::test_to_run_count(pUStack_18);
  FormatTestCount_abi_cxx11_(&local_40,(testing *)(ulong)uVar2,test_count);
  uVar3 = std::__cxx11::string::c_str();
  uVar2 = UnitTest::test_suite_to_run_count(pUStack_18);
  FormatTestSuiteCount_abi_cxx11_(&local_60,(testing *)(ulong)uVar2,test_suite_count);
  uVar4 = std::__cxx11::string::c_str();
  printf("%s from %s ran.",uVar3,uVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if ((FLAGS_gtest_print_time & 1) != 0) {
    local_98 = UnitTest::elapsed_time(pUStack_18);
    StreamableToString<long>(&local_90,&local_98);
    uVar3 = std::__cxx11::string::c_str();
    printf(" (%s ms total)",uVar3);
    std::__cxx11::string::~string((string *)&local_90);
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  uVar2 = UnitTest::successful_test_count(pUStack_18);
  FormatTestCount_abi_cxx11_((string *)local_b8,(testing *)(ulong)uVar2,test_count_00);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s.\n",uVar3);
  std::__cxx11::string::~string((string *)local_b8);
  local_bc = UnitTest::skipped_test_count(pUStack_18);
  if (0 < (int)local_bc) {
    ColoredPrintf(COLOR_GREEN,"[  SKIPPED ] ");
    FormatTestCount_abi_cxx11_((string *)local_e0,(testing *)(ulong)local_bc,test_count_01);
    uVar3 = std::__cxx11::string::c_str();
    printf("%s, listed below:\n",uVar3);
    std::__cxx11::string::~string((string *)local_e0);
    PrintSkippedTests(pUStack_18);
  }
  bVar1 = UnitTest::Passed(pUStack_18);
  if (!bVar1) {
    PrintFailedTests(pUStack_18);
    PrintFailedTestSuites(pUStack_18);
  }
  uVar2 = UnitTest::reportable_disabled_test_count(pUStack_18);
  if ((uVar2 != 0) && ((FLAGS_gtest_also_run_disabled_tests & 1) == 0)) {
    bVar1 = UnitTest::Passed(pUStack_18);
    if (bVar1) {
      printf("\n");
    }
    pcVar5 = "TESTS";
    if (uVar2 == 1) {
      pcVar5 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar2,pcVar5);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count > 0) {
    ColoredPrintf(COLOR_GREEN, "[  SKIPPED ] ");
    printf("%s, listed below:\n", FormatTestCount(skipped_test_count).c_str());
    PrintSkippedTests(unit_test);
  }

  if (!unit_test.Passed()) {
    PrintFailedTests(unit_test);
    PrintFailedTestSuites(unit_test);
  }

  int num_disabled = unit_test.reportable_disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (unit_test.Passed()) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}